

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O0

int __thiscall LlamaData::github_dl(LlamaData *this,string *model,string *bn)

{
  size_type sVar1;
  string *in_RSI;
  string *in_RDI;
  size_t i;
  string url;
  string *project;
  string *org;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  repo_parts;
  size_t at_pos;
  string branch;
  string repository;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  string *response_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *headers;
  string *in_stack_fffffffffffffdf0;
  undefined1 progress;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_stack_fffffffffffffe08;
  LlamaData *this_01;
  string local_1d8 [8];
  string *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  ulong local_1b8;
  string local_1b0 [32];
  string local_190 [32];
  string local_150 [32];
  string local_130 [32];
  const_reference local_110;
  const_reference local_108;
  undefined4 local_100;
  undefined1 local_f9 [33];
  undefined1 local_d8 [56];
  string local_a0 [32];
  long local_80;
  undefined1 local_61 [33];
  string local_40 [40];
  string *local_18;
  int local_4;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40,in_RSI);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_RDI,(allocator<char> *)in_stack_fffffffffffffdf0);
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  local_80 = std::__cxx11::string::find((char)local_18,0x40);
  if (local_80 != -1) {
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_18);
    in_stack_fffffffffffffdf0 = local_a0;
    std::__cxx11::string::operator=(local_40,in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(in_stack_fffffffffffffdf0);
    std::__cxx11::string::substr((ulong)(local_d8 + 0x18),(ulong)local_18);
    std::__cxx11::string::operator=((string *)(local_61 + 1),(string *)(local_d8 + 0x18));
    std::__cxx11::string::~string((string *)(local_d8 + 0x18));
  }
  headers = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_RDI,(allocator<char> *)in_stack_fffffffffffffdf0);
  string_split(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  std::__cxx11::string::~string((string *)(local_f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f9);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_d8);
  if (sVar1 < 3) {
    printe("Invalid GitHub repository format\n");
    local_4 = 1;
    local_100 = 1;
  }
  else {
    response_str = (string *)local_d8;
    local_108 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)response_str,0);
    local_110 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)response_str,1);
    std::operator+(in_stack_fffffffffffffe08,this_00);
    std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
    std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
    std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    std::__cxx11::string::~string(local_150);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_1b0);
    local_1b8 = 2;
    while( true ) {
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_d8);
      progress = (undefined1)((ulong)in_stack_fffffffffffffdf0 >> 0x38);
      if (sVar1 <= local_1b8) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_d8,local_1b8);
      std::operator+(in_stack_fffffffffffffe08,this_00);
      std::__cxx11::string::operator+=(local_130,local_1d8);
      std::__cxx11::string::~string(local_1d8);
      local_1b8 = local_1b8 + 1;
    }
    this_01 = (LlamaData *)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x16fb71);
    in_stack_fffffffffffffdd4 = download(this_01,this_00,in_RDI,(bool)progress,headers,response_str)
    ;
    local_4 = in_stack_fffffffffffffdd4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    local_100 = 1;
    std::__cxx11::string::~string(local_130);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::__cxx11::string::~string(local_40);
  return local_4;
}

Assistant:

int github_dl(const std::string & model, const std::string & bn) {
        std::string  repository = model;
        std::string  branch     = "main";
        const size_t at_pos     = model.find('@');
        if (at_pos != std::string::npos) {
            repository = model.substr(0, at_pos);
            branch     = model.substr(at_pos + 1);
        }

        const std::vector<std::string> repo_parts = string_split(repository, "/");
        if (repo_parts.size() < 3) {
            printe("Invalid GitHub repository format\n");
            return 1;
        }

        const std::string & org          = repo_parts[0];
        const std::string & project      = repo_parts[1];
        std::string         url          = "https://raw.githubusercontent.com/" + org + "/" + project + "/" + branch;
        for (size_t i = 2; i < repo_parts.size(); ++i) {
            url += "/" + repo_parts[i];
        }

        return download(url, bn, true);
    }